

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# canbusload.c
# Opt level: O2

void print_usage(char *prg)

{
  fprintf(_stderr,"%s - monitor CAN bus load.\n",prg);
  fprintf(_stderr,"\nUsage: %s [options] <CAN interface>+\n",prg);
  fprintf(_stderr,"  (use CTRL-C to terminate %s)\n\n",prg);
  fwrite("Options:\n",9,1,_stderr);
  fwrite("         -t  (show current time on the first line)\n",0x33,1,_stderr);
  fwrite("         -c  (colorize lines)\n",0x1e,1,_stderr);
  fprintf(_stderr,"         -b  (show bargraph in %d%% resolution)\n",5);
  fwrite("         -r  (redraw the terminal - similar to top)\n",0x34,1,_stderr);
  fwrite("         -i  (ignore bitstuffing in bandwidth calculation)\n",0x3b,1,_stderr);
  fwrite("         -e  (exact calculation of stuffed bits)\n",0x31,1,_stderr);
  fputc(10,_stderr);
  fprintf(_stderr,"Up to %d CAN interfaces with mandatory bitrate can be specified on the \n",0x10);
  fwrite("commandline in the form: <ifname>@<bitrate>[,<dbitrate>]\n\n",0x3a,1,_stderr);
  fwrite("The bitrate is mandatory as it is needed to know the CAN bus bitrate to\n",0x48,1,_stderr)
  ;
  fwrite("calculate the bus load percentage based on the received CAN frames.\n",0x44,1,_stderr);
  fprintf(_stderr,"Due to the bitstuffing estimation the calculated busload may exceed 100%%.\n");
  fwrite("For each given interface the data is presented in one line which contains:\n\n",0x4c,1,
         _stderr);
  fwrite("(interface) (received CAN frames) (used bits total) (used bits for payload)\n",0x4c,1,
         _stderr);
  fwrite("\nExamples:\n",0xb,1,_stderr);
  fwrite("\nuser$> canbusload can0@100000 can1@500000 can2@500000 can3@500000 -r -t -b -c\n\n",0x50,
         1,_stderr);
  fprintf(_stderr,"%s 2014-02-01 21:13:16 (worst case bitstuffing)\n",prg);
  fprintf(_stderr," can0@100000   805   74491  36656  74%% |XXXXXXXXXXXXXX......|\n");
  fprintf(_stderr," can1@500000   796   75140  37728  15%% |XXX.................|\n");
  fprintf(_stderr," can2@500000     0       0      0   0%% |....................|\n");
  fprintf(_stderr," can3@500000    47    4633   2424   0%% |....................|\n");
  fputc(10,_stderr);
  return;
}

Assistant:

void print_usage(char *prg)
{
	fprintf(stderr, "%s - monitor CAN bus load.\n", prg);
	fprintf(stderr, "\nUsage: %s [options] <CAN interface>+\n", prg);
	fprintf(stderr, "  (use CTRL-C to terminate %s)\n\n", prg);
	fprintf(stderr, "Options:\n");
	fprintf(stderr, "         -t  (show current time on the first line)\n");
	fprintf(stderr, "         -c  (colorize lines)\n");
	fprintf(stderr, "         -b  (show bargraph in %d%% resolution)\n", PERCENTRES);
	fprintf(stderr, "         -r  (redraw the terminal - similar to top)\n");
	fprintf(stderr, "         -i  (ignore bitstuffing in bandwidth calculation)\n");
	fprintf(stderr, "         -e  (exact calculation of stuffed bits)\n");
	fprintf(stderr, "\n");
	fprintf(stderr, "Up to %d CAN interfaces with mandatory bitrate can be specified on the \n", MAXSOCK);
	fprintf(stderr, "commandline in the form: <ifname>@<bitrate>[,<dbitrate>]\n\n");
	fprintf(stderr, "The bitrate is mandatory as it is needed to know the CAN bus bitrate to\n");
	fprintf(stderr, "calculate the bus load percentage based on the received CAN frames.\n");
	fprintf(stderr, "Due to the bitstuffing estimation the calculated busload may exceed 100%%.\n");
	fprintf(stderr, "For each given interface the data is presented in one line which contains:\n\n");
	fprintf(stderr, "(interface) (received CAN frames) (used bits total) (used bits for payload)\n");
	fprintf(stderr, "\nExamples:\n");
	fprintf(stderr, "\nuser$> canbusload can0@100000 can1@500000 can2@500000 can3@500000 -r -t -b -c\n\n");
	fprintf(stderr, "%s 2014-02-01 21:13:16 (worst case bitstuffing)\n", prg);
	fprintf(stderr, " can0@100000   805   74491  36656  74%% |XXXXXXXXXXXXXX......|\n");
	fprintf(stderr, " can1@500000   796   75140  37728  15%% |XXX.................|\n");
	fprintf(stderr, " can2@500000     0       0      0   0%% |....................|\n");
	fprintf(stderr, " can3@500000    47    4633   2424   0%% |....................|\n");
	fprintf(stderr, "\n");
}